

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

bool __thiscall anon_unknown.dwarf_38a::NinjaMain::IsPathDead(NinjaMain *this,StringPiece s)

{
  Node *pNVar1;
  TimeStamp TVar2;
  bool bVar3;
  string err;
  StringPiece local_58;
  string local_48;
  string local_28;
  
  local_58.len_ = s.len_;
  local_58.str_ = s.str_;
  pNVar1 = State::LookupNode(&this->state_,s);
  if ((pNVar1 == (Node *)0x0) || (pNVar1->in_edge_ == (Edge *)0x0)) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    StringPiece::AsString_abi_cxx11_(&local_28,&local_58);
    TVar2 = RealDiskInterface::Stat(&this->disk_interface_,&local_28,&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    if (TVar2 == -1) {
      Error("%s",local_48._M_dataplus._M_p);
    }
    bVar3 = TVar2 == 0;
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

virtual bool IsPathDead(StringPiece s) const {
    Node* n = state_.LookupNode(s);
    if (n && n->in_edge())
      return false;
    // Just checking n isn't enough: If an old output is both in the build log
    // and in the deps log, it will have a Node object in state_.  (It will also
    // have an in edge if one of its inputs is another output that's in the deps
    // log, but having a deps edge product an output that's input to another deps
    // edge is rare, and the first recompaction will delete all old outputs from
    // the deps log, and then a second recompaction will clear the build log,
    // which seems good enough for this corner case.)
    // Do keep entries around for files which still exist on disk, for
    // generators that want to use this information.
    string err;
    TimeStamp mtime = disk_interface_.Stat(s.AsString(), &err);
    if (mtime == -1)
      Error("%s", err.c_str());  // Log and ignore Stat() errors.
    return mtime == 0;
  }